

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O0

int read_user_chunk_callback(png_struct *png_ptr,png_unknown_chunkp chunk)

{
  int iVar1;
  png_uint_32 pVar2;
  user_chunk_data *data;
  user_chunk_data *my_user_chunk_data;
  png_unknown_chunkp chunk_local;
  png_struct *png_ptr_local;
  
  data = (user_chunk_data *)png_get_user_chunk_ptr(png_ptr);
  if (data == (user_chunk_data *)0x0) {
    png_error(png_ptr,"lost user chunk pointer");
  }
  if ((((chunk->name[0] == 's') && (chunk->name[1] == 'T')) && (chunk->name[2] == 'E')) &&
     (chunk->name[3] == 'R')) {
    if (chunk->size == 1) {
      if ((*chunk->data == '\0') || (*chunk->data == '\x01')) {
        iVar1 = set_location(png_ptr,data,1);
        if (iVar1 == 0) {
          png_ptr_local._4_4_ = 0;
        }
        else {
          data->sTER_mode = *chunk->data;
          png_ptr_local._4_4_ = 1;
        }
      }
      else {
        png_ptr_local._4_4_ = -1;
      }
    }
    else {
      png_ptr_local._4_4_ = -1;
    }
  }
  else if (((chunk->name[0] == 'v') && (chunk->name[1] == 'p')) &&
          ((chunk->name[2] == 'A' && (chunk->name[3] == 'g')))) {
    if (chunk->size == 9) {
      iVar1 = set_location(png_ptr,data,2);
      if (iVar1 == 0) {
        png_ptr_local._4_4_ = 0;
      }
      else {
        pVar2 = png_get_uint_31(png_ptr,chunk->data);
        data->vpAg_width = pVar2;
        pVar2 = png_get_uint_31(png_ptr,chunk->data + 4);
        data->vpAg_height = pVar2;
        data->vpAg_units = chunk->data[8];
        png_ptr_local._4_4_ = 1;
      }
    }
    else {
      png_ptr_local._4_4_ = -1;
    }
  }
  else {
    png_ptr_local._4_4_ = 0;
  }
  return png_ptr_local._4_4_;
}

Assistant:

static int PNGCBAPI
read_user_chunk_callback(png_struct *png_ptr, png_unknown_chunkp chunk)
{
   struct user_chunk_data *my_user_chunk_data =
      (struct user_chunk_data*)png_get_user_chunk_ptr(png_ptr);

   if (my_user_chunk_data == NULL)
      png_error(png_ptr, "lost user chunk pointer");

   /* Return one of the following:
    *    return (-n);  chunk had an error
    *    return (0);  did not recognize
    *    return (n);  success
    *
    * The unknown chunk structure contains the chunk data:
    * png_byte name[5];
    * png_byte *data;
    * size_t size;
    *
    * Note that libpng has already taken care of the CRC handling.
    */

   if (chunk->name[0] == 115 && chunk->name[1] ==  84 &&     /* s  T */
       chunk->name[2] ==  69 && chunk->name[3] ==  82)       /* E  R */
      {
         /* Found sTER chunk */
         if (chunk->size != 1)
            return (-1); /* Error return */

         if (chunk->data[0] != 0 && chunk->data[0] != 1)
            return (-1);  /* Invalid mode */

         if (set_location(png_ptr, my_user_chunk_data, have_sTER) != 0)
         {
            my_user_chunk_data->sTER_mode=chunk->data[0];
            return (1);
         }

         else
            return (0); /* duplicate sTER - give it to libpng */
      }

   if (chunk->name[0] != 118 || chunk->name[1] != 112 ||    /* v  p */
       chunk->name[2] !=  65 || chunk->name[3] != 103)      /* A  g */
      return (0); /* Did not recognize */

   /* Found ImageMagick vpAg chunk */

   if (chunk->size != 9)
      return (-1); /* Error return */

   if (set_location(png_ptr, my_user_chunk_data, have_vpAg) == 0)
      return (0);  /* duplicate vpAg */

   my_user_chunk_data->vpAg_width = png_get_uint_31(png_ptr, chunk->data);
   my_user_chunk_data->vpAg_height = png_get_uint_31(png_ptr, chunk->data + 4);
   my_user_chunk_data->vpAg_units = chunk->data[8];

   return (1);
}